

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O1

int parse_connection_string
              (IOTHUB_PROVISIONED_DEVICE *device_info,IOTHUB_CLIENT_CONFIG *client_config)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  LOGGER_LOG p_Var5;
  long *plVar6;
  long *plVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  size_t __size;
  ulong uVar11;
  undefined1 auVar12 [16];
  long *local_38;
  
  plVar7 = (long *)device_info->connectionString;
  iVar8 = 0;
  if ((plVar7 != (long *)0x0) && (iVar8 = 0, (char)*plVar7 != '\0')) {
    uVar11 = 0;
    do {
      if ((char)plVar7[1] == '=' && *plVar7 == 0x656d614e74736f48) {
        plVar6 = (long *)((long)plVar7 + 9);
        cVar2 = *(char *)((long)plVar7 + 9);
        if (cVar2 == '\0') {
          iVar8 = 0;
        }
        else {
          pcVar4 = (char *)((long)plVar7 + 9);
          lVar10 = 0;
          plVar7 = (long *)((long)plVar7 + 10);
          local_38 = plVar6;
          do {
            plVar6 = plVar7;
            iVar8 = 0;
            bVar1 = true;
            if (cVar2 == '.') {
              if (client_config->iotHubName == (char *)0x0) {
                sVar9 = lVar10 + 1;
                pcVar3 = (char *)malloc(sVar9);
                client_config->iotHubName = pcVar3;
                if (pcVar3 == (char *)0x0) {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                              ,"parse_connection_string",0xd6,1,"Failure allocating iothub Name");
                  }
                  cleanup_config_object(client_config);
                  iVar8 = 0xd7;
                  bVar1 = false;
                }
                else {
                  lVar10 = 0;
                  memset(pcVar3,0,sVar9);
                  memcpy(pcVar3,local_38,(long)pcVar4 - (long)local_38);
                  iVar8 = 0;
                  local_38 = plVar6;
                }
              }
            }
            else {
              iVar8 = 0;
              if (cVar2 == ';') {
                pcVar3 = (char *)malloc(lVar10 + 1U);
                client_config->iotHubSuffix = pcVar3;
                plVar6 = (long *)((long)plVar6 + -1);
                if (pcVar3 == (char *)0x0) {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                              ,"parse_connection_string",0xe9,1,"Failure allocating iothub suffix");
                  }
                  cleanup_config_object(client_config);
                  iVar8 = 0xea;
                }
                else {
                  iVar8 = 0;
                  memset(pcVar3,0,lVar10 + 1U);
                  memcpy(pcVar3,local_38,(long)pcVar4 - (long)local_38);
                }
                break;
              }
            }
            if (!bVar1) break;
            lVar10 = lVar10 + 1;
            cVar2 = (char)*plVar6;
            pcVar4 = pcVar4 + 1;
            plVar7 = (long *)((long)plVar6 + 1);
          } while (cVar2 != '\0');
        }
        uVar11 = uVar11 + 1;
      }
      else {
        if ((char)plVar7[1] == '=' && *plVar7 == 0x6449656369766544) {
          plVar7 = (long *)((long)plVar7 + 9);
          if (client_config->deviceId == (char *)0x0) {
            for (sVar9 = 0;
                (*(char *)((long)plVar7 + sVar9) != '\0' && (*(char *)((long)plVar7 + sVar9) != ';')
                ); sVar9 = sVar9 + 1) {
            }
            __size = sVar9 + 1;
            pcVar4 = (char *)malloc(__size);
            client_config->deviceId = pcVar4;
            plVar6 = (long *)(sVar9 + (long)plVar7);
            if (pcVar4 == (char *)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                          ,"parse_connection_string",0x10a,1,"Failure allocating iothub device id");
              }
              cleanup_config_object(client_config);
              iVar8 = 0x10b;
            }
            else {
LAB_0011c429:
              iVar8 = 0;
              memset(pcVar4,0,__size);
              memcpy(pcVar4,plVar7,sVar9);
            }
          }
          else {
            p_Var5 = xlogging_get_log_function();
            iVar8 = 0x117;
            plVar6 = plVar7;
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                        ,"parse_connection_string",0x116,1,
                        "invalid value state.  device previously allocated");
            }
          }
        }
        else {
          auVar12[0] = -((char)*plVar7 == 'S');
          auVar12[1] = -(*(char *)((long)plVar7 + 1) == 'h');
          auVar12[2] = -(*(char *)((long)plVar7 + 2) == 'a');
          auVar12[3] = -(*(char *)((long)plVar7 + 3) == 'r');
          auVar12[4] = -(*(char *)((long)plVar7 + 4) == 'e');
          auVar12[5] = -(*(char *)((long)plVar7 + 5) == 'd');
          auVar12[6] = -(*(char *)((long)plVar7 + 6) == 'A');
          auVar12[7] = -(*(char *)((long)plVar7 + 7) == 'c');
          auVar12[8] = -((char)plVar7[1] == 'c');
          auVar12[9] = -(*(char *)((long)plVar7 + 9) == 'e');
          auVar12[10] = -(*(char *)((long)plVar7 + 10) == 's');
          auVar12[0xb] = -(*(char *)((long)plVar7 + 0xb) == 's');
          auVar12[0xc] = -(*(char *)((long)plVar7 + 0xc) == 'K');
          auVar12[0xd] = -(*(char *)((long)plVar7 + 0xd) == 'e');
          auVar12[0xe] = -(*(char *)((long)plVar7 + 0xe) == 'y');
          auVar12[0xf] = -(*(char *)((long)plVar7 + 0xf) == '=');
          iVar8 = 0;
          plVar6 = plVar7;
          if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011c4b8;
          plVar7 = plVar7 + 2;
          iVar8 = 0;
          plVar6 = plVar7;
          if (client_config->deviceKey == (char *)0x0) {
            for (sVar9 = 0;
                (*(char *)((long)plVar7 + sVar9) != '\0' && (*(char *)((long)plVar7 + sVar9) != ';')
                ); sVar9 = sVar9 + 1) {
            }
            __size = sVar9 + 1;
            pcVar4 = (char *)malloc(__size);
            client_config->deviceKey = pcVar4;
            plVar6 = (long *)(sVar9 + (long)plVar7);
            if (pcVar4 != (char *)0x0) goto LAB_0011c429;
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                        ,"parse_connection_string",0x12a,1,"Failure allocating iothub device key");
            }
            cleanup_config_object(client_config);
            iVar8 = 299;
          }
        }
        uVar11 = uVar11 + 1;
      }
LAB_0011c4b8:
    } while (((iVar8 == 0) && (*(char *)((long)plVar6 + 1) != '\0')) &&
            (plVar7 = (long *)((long)plVar6 + 1), uVar11 < 3));
  }
  return iVar8;
}

Assistant:

static int parse_connection_string(const IOTHUB_PROVISIONED_DEVICE* device_info, IOTHUB_CLIENT_CONFIG* client_config)
{
    int result = 0;
    size_t tag_index = 0;
    size_t field_cnt = 0;
    size_t counter = 0;
    const char* initial_pos = NULL;
    const char* iterator = device_info->connectionString;
    while (iterator != NULL && *iterator != '\0' && result == 0 && field_cnt < 3)
    {
        if (memcmp(iterator, TEST_HOSTNAME_VALUE, TEST_HOSTNAME_VALUE_LEN) == 0)
        {
            counter = 0;
            iterator += TEST_HOSTNAME_VALUE_LEN;
            initial_pos = iterator;
            // Loop here and break up the hostname into it's parts
            while (*iterator != '\0' && result == 0)
            {
                if (*iterator == '.')
                {
                    if (client_config->iotHubName == NULL)
                    {
                        if ((client_config->iotHubName = (const char*)malloc(counter + 1)) == NULL)
                        {
                            LogError("Failure allocating iothub Name");
                            result = MU_FAILURE;
                            cleanup_config_object(client_config);
                        }
                        else
                        {
                            memset((char*)client_config->iotHubName, 0, counter + 1);
                            memcpy((char*)client_config->iotHubName, initial_pos, iterator - initial_pos);
                            // Change the initial position to the current pos beyond the .
                            initial_pos = iterator+1;
                            counter = 0;
                        }
                    }
                }
                else if (*iterator == ';')
                {
                    // Now get the suffix
                    if ((client_config->iotHubSuffix = (const char*)malloc(counter+1)) == NULL)
                    {
                        LogError("Failure allocating iothub suffix");
                        result = MU_FAILURE;
                        cleanup_config_object(client_config);
                    }
                    else
                    {
                        memset((char*)client_config->iotHubSuffix, 0, counter + 1);
                        memcpy((char*)client_config->iotHubSuffix, initial_pos, iterator - initial_pos);
                        initial_pos = iterator + 1;
                        counter = 0;
                    }
                    break;
                }
                iterator++;
                counter++;
            }
            field_cnt++;
        }
        else if (memcmp(iterator, TEST_DEVICEID_VALUE, TEST_DEVICEID_VALUE_LEN) == 0)
        {
            iterator += TEST_DEVICEID_VALUE_LEN;
            if (client_config->deviceId == NULL)
            {
                counter = 0;
                initial_pos = iterator;
                while (*iterator != '\0' && *iterator != ';')
                {
                    counter++;
                    iterator++;
                }

                if ((client_config->deviceId = (const char*)malloc(counter + 1)) == NULL)
                {
                    LogError("Failure allocating iothub device id");
                    result = MU_FAILURE;
                    cleanup_config_object(client_config);
                }
                else
                {
                    memset((char*)client_config->deviceId, 0, counter + 1);
                    memcpy((char*)client_config->deviceId, initial_pos, counter);
                }
            }
            else
            {
                LogError("invalid value state.  device previously allocated");
                result = MU_FAILURE;
            }
            field_cnt++;
        }
        else if (memcmp(iterator, TEST_SHARED_ACCESS_KEY_VALUE, TEST_SHARED_ACCESS_KEY_LEN) == 0)
        {
            iterator += TEST_SHARED_ACCESS_KEY_LEN;
            if (client_config->deviceKey == NULL)
            {
                counter = 0;
                initial_pos = iterator;
                while (*iterator != '\0' && *iterator != ';')
                {
                    counter++;
                    iterator++;
                }

                if ((client_config->deviceKey = (const char*)malloc(counter + 1)) == NULL)
                {
                    LogError("Failure allocating iothub device key");
                    result = MU_FAILURE;
                    cleanup_config_object(client_config);
                }
                else
                {
                    memset((char*)client_config->deviceKey, 0, counter + 1);
                    memcpy((char*)client_config->deviceKey, initial_pos, counter);
                }
            }
            field_cnt++;
        }
        iterator++;
    }
    return result;
}